

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_doctype<0>(xml_document<char> *this,char **text)

{
  char cVar1;
  char *pcVar2;
  undefined8 *puVar3;
  int iVar4;
  
  pcVar2 = *text;
  while( true ) {
    while (cVar1 = *pcVar2, cVar1 == '[') {
      pcVar2 = pcVar2 + 1;
      iVar4 = 1;
      *text = pcVar2;
      do {
        cVar1 = *pcVar2;
        if (cVar1 == '[') {
          iVar4 = iVar4 + 1;
        }
        else if (cVar1 == ']') {
          iVar4 = iVar4 + -1;
        }
        else if (cVar1 == '\0') goto LAB_00133e6e;
        pcVar2 = pcVar2 + 1;
        *text = pcVar2;
      } while (0 < iVar4);
    }
    if (cVar1 == '>') {
      *text = pcVar2 + 1;
      return (xml_node<char> *)0x0;
    }
    if (cVar1 == '\0') break;
    pcVar2 = pcVar2 + 1;
    *text = pcVar2;
  }
LAB_00133e6e:
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
  pcVar2 = *text;
  *puVar3 = &PTR__exception_00159668;
  puVar3[1] = "unexpected end of data";
  puVar3[2] = pcVar2;
  __cxa_throw(puVar3,&parse_error::typeinfo,std::exception::~exception);
}

Assistant:

xml_node<Ch> *parse_doctype(Ch *&text)
        {
            // Remember value start
            Ch *value = text;

            // Skip to >
            while (*text != Ch('>'))
            {
                // Determine character type
                switch (*text)
                {
                
                // If '[' encountered, scan for matching ending ']' using naive algorithm with depth
                // This works for all W3C test files except for 2 most wicked
                case Ch('['):
                {
                    ++text;     // Skip '['
                    int depth = 1;
                    while (depth > 0)
                    {
                        switch (*text)
                        {
                            case Ch('['): ++depth; break;
                            case Ch(']'): --depth; break;
                            case 0: RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                        }
                        ++text;
                    }
                    break;
                }
                
                // Error on end of text
                case Ch('\0'):
                    RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                
                // Other character, skip it
                default:
                    ++text;

                }
            }
            
            // If DOCTYPE nodes enabled
            if (Flags & parse_doctype_node)
            {
                // Create a new doctype node
                xml_node<Ch> *doctype = this->allocate_node(node_doctype);
                doctype->value(value, text - value);
                
                // Place zero terminator after value
                if (!(Flags & parse_no_string_terminators))
                    *text = Ch('\0');

                text += 1;      // skip '>'
                return doctype;
            }
            else
            {
                text += 1;      // skip '>'
                return 0;
            }

        }